

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

u32string * __thiscall
test_parser::serialize_u32_abi_cxx11_
          (u32string *__return_storage_ptr__,test_parser *this,object *in_object)

{
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *in_string;
  jessilib local_40 [32];
  object *local_20;
  object *in_object_local;
  test_parser *this_local;
  
  local_20 = in_object;
  in_object_local = (object *)this;
  this_local = (test_parser *)__return_storage_ptr__;
  (**(code **)((long)*this + 0x30))(local_40,this,in_object);
  jessilib::string_cast<char32_t,std::__cxx11::u8string>(__return_storage_ptr__,local_40,in_string);
  std::__cxx11::u8string::~u8string((u8string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::u32string serialize_u32(const object& in_object) override { return string_cast<char32_t>(serialize_u8(in_object)); }